

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Operator::Operator(Operator *this)

{
  Operator *this_local;
  
  this->chanData = 0;
  this->freqMul = 0;
  this->waveIndex = 0;
  this->waveAdd = 0;
  this->waveCurrent = 0;
  this->keyOn = '\0';
  this->ksr = '\0';
  this->reg20 = '\0';
  this->reg40 = '\0';
  this->reg60 = '\0';
  this->reg80 = '\0';
  this->regE0 = '\0';
  SetState(this,'\0');
  this->rateZero = '\x01';
  this->sustainLevel = 0x1ff;
  this->currentLevel = 0x1ff;
  this->totalLevel = 0x1ff;
  this->volume = 0x1ff;
  this->releaseAdd = 0;
  return;
}

Assistant:

Operator::Operator() {
	chanData = 0;
	freqMul = 0;
	waveIndex = 0;
	waveAdd = 0;
	waveCurrent = 0;
	keyOn = 0;
	ksr = 0;
	reg20 = 0;
	reg40 = 0;
	reg60 = 0;
	reg80 = 0;
	regE0 = 0;
	SetState( OFF );
	rateZero = (1 << OFF);
	sustainLevel = ENV_MAX;
	currentLevel = ENV_MAX;
	totalLevel = ENV_MAX;
	volume = ENV_MAX;
	releaseAdd = 0;
}